

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemorySize
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemorySize *curr)

{
  Name name;
  Name memory_00;
  address64_t x;
  Literal local_a0;
  ModuleRunner *local_88;
  size_t sStack_80;
  Memory *local_70;
  Memory *memory;
  size_t sStack_60;
  Address local_50;
  Address memorySize;
  undefined1 local_38 [8];
  MemoryInstanceInfo info;
  MemorySize *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  memorySize.addr = (curr->memory).super_IString.str._M_len;
  info.name.super_IString.str._M_str = (char *)curr;
  getMemoryInstanceInfo((MemoryInstanceInfo *)local_38,this,(Name)(curr->memory).super_IString.str);
  memory = (Memory *)info.instance;
  sStack_60 = info.name.super_IString.str._M_len;
  memory_00.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
  memory_00.super_IString.str._M_len = (size_t)info.instance;
  local_50 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_38,memory_00);
  local_88 = info.instance;
  sStack_80 = info.name.super_IString.str._M_len;
  name.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)info.instance;
  local_70 = Module::getMemory(*(Module **)((long)local_38 + 0x20),name);
  x = wasm::Address::operator_cast_to_unsigned_long(&local_50);
  wasm::Literal::makeFromInt64(&local_a0,x,(Type)(local_70->addressType).id);
  Flow::Flow(__return_storage_ptr__,&local_a0);
  wasm::Literal::~Literal(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemorySize(MemorySize* curr) {
    NOTE_ENTER("MemorySize");
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto* memory = info.instance->wasm.getMemory(info.name);
    return Literal::makeFromInt64(memorySize, memory->addressType);
  }